

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O2

int EVP_EncodedLength(size_t *out_len,size_t len)

{
  if (len < 0xbffffffffffffffe) {
    *out_len = ((len + 2) / 3) * 4 + 1;
  }
  return (uint)(len < 0xbffffffffffffffe);
}

Assistant:

int EVP_EncodedLength(size_t *out_len, size_t len) {
  if (len + 2 < len) {
    return 0;
  }
  len += 2;
  len /= 3;

  if (((len << 2) >> 2) != len) {
    return 0;
  }
  len <<= 2;

  if (len + 1 < len) {
    return 0;
  }
  len++;

  *out_len = len;
  return 1;
}